

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

int __thiscall Dice::addToCount(Dice *this)

{
  mapped_type *pmVar1;
  key_type local_2c [7];
  Dice *pDStack_10;
  int count;
  Dice *this_local;
  
  local_2c[6] = 0;
  local_2c[5] = 1;
  pDStack_10 = this;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_2c + 5);
  local_2c[6] = *pmVar1 + local_2c[6];
  local_2c[4] = 4;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_2c + 4);
  local_2c[6] = *pmVar1 + local_2c[6];
  local_2c[3] = 2;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_2c + 3);
  local_2c[6] = *pmVar1 + local_2c[6];
  local_2c[2] = 5;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_2c + 2);
  local_2c[6] = *pmVar1 + local_2c[6];
  local_2c[1] = 0;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_2c + 1);
  local_2c[6] = *pmVar1 + local_2c[6];
  local_2c[0] = Heal;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_2c);
  return *pmVar1 + local_2c[6];
}

Assistant:

int Dice::addToCount() {
    int count =0;
    count += resolvedHand[DiceOptions::Attack];
    count += resolvedHand[DiceOptions::Celebrity];
    count += resolvedHand[DiceOptions::Destruction];
    count += resolvedHand[DiceOptions::Ouch];
    count += resolvedHand[DiceOptions::Energy];
    count += resolvedHand[DiceOptions::Heal];
    return count;
}